

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void __thiscall
AlignmentRecord::overlapMerge
          (AlignmentRecord *this,string *algn,string *ref,AlignmentRecord *ar,string *dna,
          string *qualities,string *nucigar,int *c_pos1,int *c_pos2,int *q_pos1,int *q_pos2,
          int *ref_pos,int *ref_rel_pos,int i,int j)

{
  byte bVar1;
  byte bVar2;
  pointer pcVar3;
  int *piVar4;
  vector<char,_std::allocator<char>_> *pvVar5;
  ShortDnaSequence *this_00;
  char cVar6;
  ShortDnaSequence *this_01;
  bool bVar11;
  bool bVar12;
  int *local_98;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50[0] = local_40;
  if (i == 1) {
    bVar1 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[*c_pos1];
    pcVar3 = (this->reference_seq1)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar3,pcVar3 + (this->reference_seq1)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    this_00 = &this->sequence1;
  }
  else {
    bVar1 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[*c_pos1];
    pcVar3 = (this->reference_seq2)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar3,pcVar3 + (this->reference_seq2)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    this_00 = &this->sequence2;
  }
  local_98 = c_pos2;
  pvVar5 = &ar->cigar2_unrolled;
  if (j == 1) {
    pvVar5 = &ar->cigar1_unrolled;
  }
  this_01 = &ar->sequence1;
  if (j != 1) {
    this_01 = &ar->sequence2;
  }
  bVar2 = (pvVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start[*c_pos2];
  cVar6 = (char)ref;
  cVar7 = (char)nucigar;
  cVar8 = (char)algn;
  cVar9 = (char)dna;
  cVar10 = (char)qualities;
  if ((bVar1 == 0x4d) && (bVar2 == 0x4d)) {
LAB_00172e2a:
    ShortDnaSequence::operator[](this_00,(long)*q_pos1);
    ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
    ShortDnaSequence::operator[](this_01,(long)*q_pos2);
    ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
    std::__cxx11::string::push_back(cVar9);
    std::__cxx11::string::push_back(cVar8);
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar7);
    if (bVar1 == 0x49) {
      std::__cxx11::string::push_back(cVar6);
    }
    else {
      if (local_68 <= (ulong)(long)*ref_rel_pos) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::__cxx11::string::push_back(cVar6);
LAB_00173039:
      *ref_rel_pos = *ref_rel_pos + 1;
      *ref_pos = *ref_pos + 1;
    }
    *q_pos1 = *q_pos1 + 1;
    *q_pos2 = *q_pos2 + 1;
    *c_pos1 = *c_pos1 + 1;
    goto LAB_00173064;
  }
  if ((bVar1 == 0x53) && (bVar2 == 0x53)) goto LAB_00173039;
  if ((bVar1 == 0x49) && (bVar2 == 0x49)) goto LAB_00172e2a;
  if ((bVar1 == 0x44) && (bVar2 == 0x44)) {
LAB_00172ece:
    *c_pos1 = *c_pos1 + 1;
    *c_pos2 = *c_pos2 + 1;
    if (local_68 <= (ulong)(long)*ref_rel_pos) {
LAB_001734a0:
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    }
    std::__cxx11::string::push_back(cVar6);
    *ref_rel_pos = *ref_rel_pos + 1;
    *ref_pos = *ref_pos + 1;
    if ((bVar1 == 0x44) || (bVar2 == 0x44)) {
      std::__cxx11::string::push_back(cVar7);
      std::__cxx11::string::push_back(cVar8);
    }
    local_98 = q_pos1;
    piVar4 = q_pos2;
    if (bVar1 != 0x53) {
joined_r0x001731e0:
      local_98 = piVar4;
      if (bVar2 != 0x53) goto LAB_0017306a;
    }
  }
  else {
    bVar11 = bVar1 == 0x44;
    bVar12 = bVar1 == 0x48;
    if (((((bVar12 || bVar11) && bVar2 == 0x48) || (bVar12 && bVar2 == 0x44)) ||
        (bVar11 && bVar2 == 0x53)) || (bVar1 == 0x53 && bVar2 == 0x44)) goto LAB_00172ece;
    local_98 = q_pos2;
    if (bVar1 == 0x4d) {
      if (((0xf < bVar2 - 0x44) || ((0x8011U >> (bVar2 - 0x44 & 0x1f) & 1) == 0)) &&
         ((!bVar12 && !bVar11 || (bVar2 != 0x4d)))) {
LAB_0017322f:
        if ((bVar1 != 0x49) && (bVar2 != 0x49)) goto LAB_0017306a;
        if (bVar1 == 0x49) {
          std::__cxx11::string::push_back(cVar7);
          ShortDnaSequence::operator[](this_00,(long)*q_pos1);
          std::__cxx11::string::push_back(cVar9);
          ShortDnaSequence::operator[](this_00,(long)*q_pos1);
          std::__cxx11::string::push_back(cVar8);
          ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
          std::__cxx11::string::push_back(cVar10);
          std::__cxx11::string::push_back(cVar6);
          *c_pos1 = *c_pos1 + 1;
          local_98 = q_pos1;
        }
        else {
          std::__cxx11::string::push_back(cVar7);
          ShortDnaSequence::operator[](this_01,(long)*q_pos2);
          std::__cxx11::string::push_back(cVar9);
          ShortDnaSequence::operator[](this_01,(long)*q_pos2);
          std::__cxx11::string::push_back(cVar8);
          ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
          std::__cxx11::string::push_back(cVar10);
          std::__cxx11::string::push_back(cVar6);
          *c_pos2 = *c_pos2 + 1;
        }
        goto LAB_00173064;
      }
      std::__cxx11::string::push_back(cVar7);
      ShortDnaSequence::operator[](this_00,(long)*q_pos1);
      std::__cxx11::string::push_back(cVar9);
      ShortDnaSequence::operator[](this_00,(long)*q_pos1);
      std::__cxx11::string::push_back(cVar8);
      ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
      std::__cxx11::string::push_back(cVar10);
      if (local_68 <= (ulong)(long)*ref_rel_pos) goto LAB_001734a0;
      std::__cxx11::string::push_back(cVar6);
      *ref_rel_pos = *ref_rel_pos + 1;
      *ref_pos = *ref_pos + 1;
      *c_pos1 = *c_pos1 + 1;
      *c_pos2 = *c_pos2 + 1;
      *q_pos1 = *q_pos1 + 1;
      piVar4 = q_pos2;
      goto joined_r0x001731e0;
    }
    if ((((!bVar12 && !bVar11) && bVar1 != 0x53 || bVar2 != 0x4d) &&
        (bVar1 != 0x53 || bVar2 != 0x48)) && (bVar2 != 0x53 || bVar1 != 0x48)) goto LAB_0017322f;
    if (bVar2 == 0x4d) {
      std::__cxx11::string::push_back(cVar7);
      ShortDnaSequence::operator[](this_01,(long)*q_pos2);
      std::__cxx11::string::push_back(cVar9);
      ShortDnaSequence::operator[](this_01,(long)*q_pos2);
      std::__cxx11::string::push_back(cVar8);
      ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
      std::__cxx11::string::push_back(cVar10);
      if (local_68 <= (ulong)(long)*ref_rel_pos) goto LAB_001734a0;
      std::__cxx11::string::push_back(cVar6);
      *ref_rel_pos = *ref_rel_pos + 1;
      *ref_pos = *ref_pos + 1;
      *c_pos1 = *c_pos1 + 1;
      *c_pos2 = *c_pos2 + 1;
      *q_pos2 = *q_pos2 + 1;
      piVar4 = q_pos1;
      bVar2 = bVar1;
      goto joined_r0x001731e0;
    }
    *ref_rel_pos = *ref_rel_pos + 1;
    *ref_pos = *ref_pos + 1;
    *c_pos1 = *c_pos1 + 1;
    *c_pos2 = *c_pos2 + 1;
    if (bVar1 == 0x53) {
      local_98 = q_pos1;
    }
  }
LAB_00173064:
  *local_98 = *local_98 + 1;
LAB_0017306a:
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void AlignmentRecord::overlapMerge(std::string& algn,std::string& ref,const AlignmentRecord& ar, std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos1, int& c_pos2, int& q_pos1, int& q_pos2, int& ref_pos, int& ref_rel_pos, int i, int j) const{
    char c1, c2;
    const ShortDnaSequence* s1,* s2 = 0;
    std::string r = "";
    if (i == 1){
        c1 = this->cigar1_unrolled[c_pos1];
        s1 = &this->sequence1;
        r = this->getReferenceSeq1();
        if(j == 1){
            c2 = ar.getCigar1Unrolled()[c_pos2];
            s2 = &ar.getSequence1();
        } else {
            c2 = ar.getCigar2Unrolled()[c_pos2];
            s2 = &ar.getSequence2();
        }
    } else {
        c1 = this->cigar2_unrolled[c_pos1];

        s1 = &this->sequence2;
        r = this->getReferenceSeq2();
        if(j == 1){
            c2 = ar.getCigar1Unrolled()[c_pos2];
            s2 = &ar.getSequence1();
        } else {
            c2 = ar.getCigar2Unrolled()[c_pos2];
            s2 = &ar.getSequence2();
        }
    }
    if((c1 == 'M' && c2 == 'M') || (c1 == 'S' && c2 == 'S') || (c1 == 'I' && c2 == 'I')){

        if (c1 != 'S'){
            std::pair<char,char> resPair = computeEntry((*s1)[q_pos1],s1->qualityChar(q_pos1),(*s2)[q_pos2],s2->qualityChar(q_pos2));
            dna += resPair.first;
            algn += resPair.first;
            qualities += resPair.second;
            nucigar += c1;
            if(c1=='I'){
                ref+= 'I';
            }else{
                ref+= r.at(ref_rel_pos);
            }
        }
        if (c1 != 'I'){
            ref_rel_pos++;
            ref_pos++;
        }
        q_pos1++;
        q_pos2++;
        c_pos1++;
        c_pos2++;
    } else if ((c1 == 'D' && c2 == 'D') || (c1 == 'H' && c2 == 'H') || (c1 == 'D' && c2 == 'H') || (c1 == 'H' && c2 == 'D') || (c1 == 'D' && c2 == 'S') || (c1 == 'S' && c2 == 'D')){

        c_pos1++;
        c_pos2++;
        ref+= r.at(ref_rel_pos);
        ref_rel_pos++;
        ref_pos++;
        if (c1 == 'D' || c2 == 'D'){
            nucigar += 'D';
            algn +='D';
        }
        if (c1 == 'S'){
            q_pos1++;
        } else if(c2 == 'S'){
            q_pos2++;
        }
    } else if ((c1 == 'M' && (c2 == 'D' || c2 == 'H' || c2 == 'S')) || ((c1 == 'D' || c1 == 'H' || c1 == 'S') && c2 == 'M') || (c1 == 'S' && c2 == 'H') || (c1 == 'H' && c2 == 'S')) {

        if (c1 == 'M'){
            nucigar += 'M';
            dna += (*s1)[q_pos1];
            algn+=(*s1)[q_pos1];
            qualities += s1->qualityChar(q_pos1);
            ref+= r.at(ref_rel_pos);
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
            if (c2 == 'S') q_pos2++;
        } else if (c2 == 'M'){
            nucigar += 'M';
            dna +=  (*s2)[q_pos2];
            algn+= (*s2)[q_pos2];
            qualities += s2->qualityChar(q_pos2);
            ref+= r.at(ref_rel_pos);
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
            if (c1 == 'S') q_pos1++;
        } else if (c1 == 'S'){
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
        } else {
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
        }
    } else if (c1 == 'I' || c2 == 'I'){

        if(c1 == 'I'){
            nucigar += 'I';
            dna += (*s1)[q_pos1];
            algn+=(*s1)[q_pos1];
            qualities += s1->qualityChar(q_pos1);
            ref+= 'I';
            c_pos1++;
            q_pos1++;
        } else {
            nucigar += 'I';
            dna +=  (*s2)[q_pos2];
            algn+=(*s2)[q_pos2];
            qualities += s2->qualityChar(q_pos2);
            ref+= 'I';
            c_pos2++;
            q_pos2++;
        }
    } else{
        assert(false);
    }
}